

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519_test.cc
# Opt level: O0

void __thiscall
Ed25519Test_KeypairFromSeed_Test::~Ed25519Test_KeypairFromSeed_Test
          (Ed25519Test_KeypairFromSeed_Test *this)

{
  Ed25519Test_KeypairFromSeed_Test *this_local;
  
  ~Ed25519Test_KeypairFromSeed_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Ed25519Test, KeypairFromSeed) {
  uint8_t public_key1[32], private_key1[64];
  ED25519_keypair(public_key1, private_key1);

  uint8_t seed[32];
  OPENSSL_memcpy(seed, private_key1, sizeof(seed));
  CONSTTIME_SECRET(seed, sizeof(seed));

  uint8_t public_key2[32], private_key2[64];
  ED25519_keypair_from_seed(public_key2, private_key2, seed);
  CONSTTIME_DECLASSIFY(public_key2, sizeof(public_key2));
  CONSTTIME_DECLASSIFY(private_key2, sizeof(private_key2));

  EXPECT_EQ(Bytes(public_key1), Bytes(public_key2));
  EXPECT_EQ(Bytes(private_key1), Bytes(private_key2));
}